

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

void C_SearchForPullins(FExecList *exec,char *file,FCommandLine *argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int i;
  FString path;
  
  if (exec == (FExecList *)0x0) {
    __assert_fail("exec != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_dispatch.cpp"
                  ,0x633,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_dispatch.cpp"
                  ,0x634,"void C_SearchForPullins(FExecList *, const char *, FCommandLine &)");
  }
  pcVar3 = strrchr(file,0x2f);
  i = 1;
  do {
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 <= i) {
      return;
    }
    if (pcVar3 == (char *)0x0) {
LAB_00377344:
      pcVar4 = FCommandLine::operator[](argv,i);
      FString::FString(&path,pcVar4);
      TArray<FString,_FString>::Push(&exec->Pullins,&path);
    }
    else {
      FString::FString(&path,file,(size_t)(pcVar3 + (1 - (long)file)));
      pcVar4 = FCommandLine::operator[](argv,i);
      FString::operator+=(&path,pcVar4);
      bVar1 = FileExists(path.Chars);
      if (!bVar1) {
        FString::~FString(&path);
        goto LAB_00377344;
      }
      TArray<FString,_FString>::Push(&exec->Pullins,&path);
    }
    FString::~FString(&path);
    i = i + 1;
  } while( true );
}

Assistant:

void C_SearchForPullins(FExecList *exec, const char *file, FCommandLine &argv)
{
	const char *lastSlash;

	assert(exec != NULL);
	assert(file != NULL);
#ifdef __unix__
	lastSlash = strrchr(file, '/');
#else
	const char *lastSlash1, *lastSlash2;

	lastSlash1 = strrchr(file, '/');
	lastSlash2 = strrchr(file, '\\');
	lastSlash = MAX(lastSlash1, lastSlash2);
#endif

	for (int i = 1; i < argv.argc(); ++i)
	{
		// Try looking for the wad in the same directory as the .cfg
		// before looking for it in the current directory.
		if (lastSlash != NULL)
		{
			FString path(file, (lastSlash - file) + 1);
			path += argv[i];
			if (FileExists(path))
			{
				exec->Pullins.Push(path);
				continue;
			}
		}
		exec->Pullins.Push(argv[i]);
	}
}